

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEES_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::SEES_PDU::~SEES_PDU(SEES_PDU *this)

{
  pointer pPVar1;
  pointer pPVar2;
  pointer pVVar3;
  pointer pVVar4;
  pointer pVVar5;
  pointer pPVar6;
  
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__SEES_PDU_00222ec8;
  pPVar1 = (this->m_vPropSys).
           super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->m_vPropSys).
           super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pPVar6 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      (**(pPVar6->super_DataTypeBase)._vptr_DataTypeBase)(pPVar6);
      pPVar6 = pPVar6 + 1;
    } while (pPVar6 != pPVar2);
    (this->m_vPropSys).
    super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  pVVar3 = (this->m_vVecNozzleSys).
           super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (this->m_vVecNozzleSys).
           super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pVVar5 = pVVar3;
  if (pVVar4 != pVVar3) {
    do {
      (**(pVVar5->super_DataTypeBase)._vptr_DataTypeBase)(pVVar5);
      pVVar5 = pVVar5 + 1;
    } while (pVVar5 != pVVar4);
    (this->m_vVecNozzleSys).
    super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar3;
  }
  std::
  vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
  ::~vector(&this->m_vVecNozzleSys);
  std::vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
  ::~vector(&this->m_vPropSys);
  DATA_TYPE::EntityIdentifier::~EntityIdentifier(&this->m_OriginatingEntity);
  Header7::~Header7(&this->super_Header);
  return;
}

Assistant:

SEES_PDU::~SEES_PDU()
{
    m_vPropSys.clear();
    m_vVecNozzleSys.clear();
}